

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O0

void Qentem::StringUtils::EscapeHTMLSpecialChars<Qentem::StringStream<char>,char>
               (StringStream<char> *stream,char *str,SizeT length)

{
  bool bVar1;
  uint uVar2;
  char *left;
  char *n_str;
  SizeT rem_length;
  SizeT index;
  SizeT offset;
  SizeT length_local;
  char *str_local;
  StringStream<char> *stream_local;
  
  rem_length = 0;
  n_str._4_4_ = 0;
  while (n_str._4_4_ < length) {
    switch(str[n_str._4_4_]) {
    case '\"':
      StringStream<char>::Write(stream,str + rem_length,n_str._4_4_ - rem_length);
      StringStream<char>::Write(stream,"&quot;",6);
      n_str._4_4_ = n_str._4_4_ + 1;
      rem_length = n_str._4_4_;
      break;
    default:
      n_str._4_4_ = n_str._4_4_ + 1;
      break;
    case '&':
      uVar2 = length - n_str._4_4_;
      left = str + n_str._4_4_;
      if (((uVar2 < 6) || (left[5] != ';')) ||
         ((bVar1 = IsEqual<char>(left,"&quot;",5), !bVar1 &&
          (bVar1 = IsEqual<char>(left,"&apos;",5), !bVar1)))) {
        if (((uVar2 < 5) || (left[4] != ';')) || (bVar1 = IsEqual<char>(left,"&amp;",4), !bVar1)) {
          if (((uVar2 < 4) || (left[3] != ';')) ||
             ((bVar1 = IsEqual<char>(left,"&lt;",3), !bVar1 &&
              (bVar1 = IsEqual<char>(left,"&gt;",3), !bVar1)))) {
            StringStream<char>::Write(stream,str + rem_length,n_str._4_4_ - rem_length);
            StringStream<char>::Write(stream,"&amp;",5);
            n_str._4_4_ = n_str._4_4_ + 1;
            rem_length = n_str._4_4_;
          }
          else {
            n_str._4_4_ = n_str._4_4_ + 4;
          }
        }
        else {
          n_str._4_4_ = n_str._4_4_ + 5;
        }
      }
      else {
        n_str._4_4_ = n_str._4_4_ + 6;
      }
      break;
    case '\'':
      StringStream<char>::Write(stream,str + rem_length,n_str._4_4_ - rem_length);
      StringStream<char>::Write(stream,"&apos;",6);
      n_str._4_4_ = n_str._4_4_ + 1;
      rem_length = n_str._4_4_;
      break;
    case '<':
      StringStream<char>::Write(stream,str + rem_length,n_str._4_4_ - rem_length);
      StringStream<char>::Write(stream,"&lt;",4);
      n_str._4_4_ = n_str._4_4_ + 1;
      rem_length = n_str._4_4_;
      break;
    case '>':
      StringStream<char>::Write(stream,str + rem_length,n_str._4_4_ - rem_length);
      StringStream<char>::Write(stream,"&gt;",4);
      n_str._4_4_ = n_str._4_4_ + 1;
      rem_length = n_str._4_4_;
    }
  }
  StringStream<char>::Write(stream,str + rem_length,length - rem_length);
  return;
}

Assistant:

static void EscapeHTMLSpecialChars(StringStream_T &stream, const Char_T *str, SizeT length) {
    using HTMLSpecialChars = HTMLSpecialChars_T<Char_T, sizeof(Char_T)>;

    if (Config::AutoEscapeHTML) {
        SizeT offset = 0;
        SizeT index  = 0;

        while (index < length) {
            switch (str[index]) {
                case '&': {
                    const SizeT   rem_length = (length - index);
                    const Char_T *n_str      = (str + index);

                    if ((rem_length > SizeT{5}) && (n_str[SizeT{5}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLQuote, SizeT{5}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLSingleQuote, SizeT{5})) {
                            index += SizeT{6};
                            break;
                        }
                    }

                    if ((rem_length > SizeT{4}) && (n_str[SizeT{4}] == HTMLSpecialChars::SemicolonChar) &&
                        StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLAnd, SizeT{4})) {
                        index += SizeT{5};
                        break;
                    }

                    if ((rem_length > SizeT{3}) && (n_str[SizeT{3}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLLess, SizeT{3}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLGreater, SizeT{3})) {
                            index += SizeT{4};
                            break;
                        }
                    }

                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLAnd, HTMLSpecialChars::HTMLAndLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '<': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLLess, HTMLSpecialChars::HTMLLessLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '>': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLGreater, HTMLSpecialChars::HTMLGreaterLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '"': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLQuote, HTMLSpecialChars::HTMLQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '\'': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLSingleQuote, HTMLSpecialChars::HTMLSingleQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                default: {
                    ++index;
                }
            }
        }

        stream.Write((str + offset), (length - offset));
    } else {
        stream.Write(str, length);
    }
}